

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

Expression * __thiscall slang::ast::CoverageOptionSetter::getExpression(CoverageOptionSetter *this)

{
  int iVar1;
  Scope *scope;
  Scope *scope_;
  ExpressionSyntax *pEVar2;
  undefined4 extraout_var;
  AssignmentExpression *this_00;
  bitmask<slang::ast::ASTFlags> in_RDI;
  ASTContext context;
  bool isTypeOpt;
  bitmask<slang::ast::ASTFlags> flags;
  Expression *in_stack_000002c8;
  ASTContext *in_stack_000002d0;
  bitmask<slang::ast::EvalFlags> in_stack_000002df;
  ASTContext *in_stack_ffffffffffffff38;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *__range;
  LookupLocation in_stack_ffffffffffffff48;
  CoverageOptionSetter *in_stack_ffffffffffffff58;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff90;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
  in_stack_ffffffffffffff98;
  sockaddr local_58 [3];
  bitmask<slang::ast::ASTFlags> local_20;
  byte local_11;
  bitmask<slang::ast::ASTFlags> local_10 [2];
  
  if (((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
      (in_RDI.m_bits + 0x10))->_M_ptr == (pointer)0x0) {
    bitmask<slang::ast::ASTFlags>::bitmask(local_10,AssignmentAllowed);
    local_11 = isTypeOption(in_stack_ffffffffffffff58);
    if ((bool)local_11) {
      bitmask<slang::ast::ASTFlags>::bitmask(&local_20,StaticInitializer);
      bitmask<slang::ast::ASTFlags>::operator|=(local_10,&local_20);
    }
    scope = not_null<const_slang::ast::Scope_*>::operator*
                      ((not_null<const_slang::ast::Scope_*> *)0x8c03a7);
    scope_ = not_null::operator_cast_to_Scope_((not_null<const_slang::ast::Scope_*> *)0x8c03b6);
    LookupLocation::LookupLocation((LookupLocation *)&stack0xffffffffffffff98,scope_,3);
    bitmask<slang::ast::ASTFlags>::bitmask
              ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffff90,None);
    ASTContext::ASTContext(in_stack_ffffffffffffff38,scope,in_stack_ffffffffffffff48,in_RDI);
    not_null<const_slang::syntax::CoverageOptionSyntax_*>::operator->
              ((not_null<const_slang::syntax::CoverageOptionSyntax_*> *)0x8c0404);
    pEVar2 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                       ((not_null<slang::syntax::ExpressionSyntax_*> *)0x8c0410);
    iVar1 = Expression::bind((int)pEVar2,local_58,(socklen_t)local_10[0].m_bits);
    ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
    (in_RDI.m_bits + 0x10))->_M_ptr = (pointer)CONCAT44(extraout_var,iVar1);
    __range = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
              ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
              (in_RDI.m_bits + 0x10))->_M_ptr;
    not_null<const_slang::syntax::CoverageOptionSyntax_*>::operator->
              ((not_null<const_slang::syntax::CoverageOptionSyntax_*> *)0x8c044d);
    std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
    span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
              ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
               in_RDI.m_bits,__range);
    ASTContext::setAttributes
              ((ASTContext *)in_stack_ffffffffffffff90.m_bits,(Expression *)local_10[0].m_bits,
               in_stack_ffffffffffffff98);
    if (((local_11 & 1) != 0) &&
       (*(int *)((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                  *)(in_RDI.m_bits + 0x10))->_M_ptr == 0xe)) {
      this_00 = Expression::as<slang::ast::AssignmentExpression>
                          ((Expression *)
                           ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                             *)(in_RDI.m_bits + 0x10))->_M_ptr);
      AssignmentExpression::right(this_00);
      memset(&stack0xffffffffffffff4f,0,1);
      bitmask<slang::ast::EvalFlags>::bitmask
                ((bitmask<slang::ast::EvalFlags> *)&stack0xffffffffffffff4f);
      ASTContext::eval(in_stack_000002d0,in_stack_000002c8,in_stack_000002df);
      slang::ConstantValue::~ConstantValue((ConstantValue *)0x8c04ec);
    }
  }
  return (Expression *)
         ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
         (in_RDI.m_bits + 0x10))->_M_ptr;
}

Assistant:

const Expression& CoverageOptionSetter::getExpression() const {
    if (!expr) {
        bitmask<ASTFlags> flags = ASTFlags::AssignmentAllowed;
        bool isTypeOpt = isTypeOption();
        if (isTypeOpt)
            flags |= ASTFlags::StaticInitializer;

        ASTContext context(*scope, LookupLocation(scope, 3));
        expr = &Expression::bind(*syntax->expr, context, flags);
        context.setAttributes(*expr, syntax->attributes);

        if (isTypeOpt && expr->kind == ExpressionKind::Assignment)
            context.eval(expr->as<AssignmentExpression>().right());
    }
    return *expr;
}